

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
* __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::GetAction(OnCallSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            *this)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  FailureReporterInterface *pFVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = *(int *)(this + 0xc);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,".WillByDefault() must appear exactly once in an ON_CALL().","");
  if (iVar1 != 2) {
    uVar2 = *(uint *)(this + 8);
    uVar3 = *(undefined8 *)this;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,1,uVar3,(ulong)uVar2,local_40);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return (Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)(this + 0x88);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }